

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.c
# Opt level: O0

void InitShader(uint32_t *shaderId,char *vertexSrc,char *fragmentSrc)

{
  GLuint GVar1;
  GLchar *__ptr;
  GLchar *in_RDX;
  GLchar *in_RSI;
  GLuint *in_RDI;
  char *infoLog_2;
  GLint maxLength_2;
  GLint isLinked;
  GLuint program;
  char *infoLog_1;
  GLint maxLength_1;
  GLuint fragmentShader;
  char *infoLog;
  GLint maxLength;
  GLint isCompiled;
  GLchar *source;
  GLuint vertexShader;
  GLint local_54;
  GLint local_50;
  GLuint local_4c;
  GLchar *local_48;
  GLint local_40;
  GLuint local_3c;
  GLchar *local_38;
  GLint local_30;
  GLint local_2c;
  GLchar *local_28;
  GLuint local_1c;
  GLchar *local_18;
  GLchar *local_10;
  GLuint *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_1c = (*glad_glCreateShader)(0x8b31);
  local_28 = local_10;
  (*glad_glShaderSource)(local_1c,1,&local_28,(GLint *)0x0);
  (*glad_glCompileShader)(local_1c);
  local_2c = 0;
  (*glad_glGetShaderiv)(local_1c,0x8b81,&local_2c);
  if (local_2c == 0) {
    local_30 = 0;
    (*glad_glGetShaderiv)(local_1c,0x8b84,&local_30);
    local_38 = (GLchar *)malloc((long)local_30);
    (*glad_glGetShaderInfoLog)(local_1c,local_30,&local_30,local_38);
    (*glad_glDeleteShader)(local_1c);
    fprintf(_stderr,"%s",local_38);
    fprintf(_stderr,"Vertex shader compilation failed!\n");
    free(local_38);
  }
  else {
    local_3c = (*glad_glCreateShader)(0x8b30);
    local_28 = local_18;
    (*glad_glShaderSource)(local_3c,1,&local_28,(GLint *)0x0);
    (*glad_glCompileShader)(local_3c);
    (*glad_glGetShaderiv)(local_3c,0x8b81,&local_2c);
    if (local_2c == 0) {
      local_40 = 0;
      (*glad_glGetShaderiv)(local_3c,0x8b84,&local_40);
      local_48 = (GLchar *)malloc((long)local_40);
      (*glad_glGetShaderInfoLog)(local_3c,local_40,&local_40,local_48);
      (*glad_glDeleteShader)(local_3c);
      (*glad_glDeleteShader)(local_1c);
      fprintf(_stderr,"%s",local_48);
      fprintf(_stderr,"Fragment shader compilation failed!\n");
      free(local_48);
    }
    else {
      GVar1 = (*glad_glCreateProgram)();
      *local_8 = GVar1;
      local_4c = *local_8;
      (*glad_glAttachShader)(local_4c,local_1c);
      (*glad_glAttachShader)(local_4c,local_3c);
      (*glad_glLinkProgram)(local_4c);
      local_50 = 0;
      (*glad_glGetProgramiv)(local_4c,0x8b82,&local_50);
      if (local_50 == 0) {
        local_54 = 0;
        (*glad_glGetProgramiv)(local_4c,0x8b84,&local_54);
        __ptr = (GLchar *)malloc((long)local_54);
        (*glad_glGetProgramInfoLog)(local_4c,local_54,&local_54,__ptr);
        (*glad_glDeleteProgram)(local_4c);
        (*glad_glDeleteShader)(local_1c);
        (*glad_glDeleteShader)(local_3c);
        fprintf(_stderr,"%s",__ptr);
        fprintf(_stderr,"Shader linking failed!\n");
        free(__ptr);
      }
      else {
        (*glad_glDetachShader)(local_4c,local_1c);
        (*glad_glDetachShader)(local_4c,local_3c);
      }
    }
  }
  return;
}

Assistant:

void InitShader(uint32_t * shaderId, const char* vertexSrc, const char* fragmentSrc) {
    // Create an empty vertex shader handle
    GLuint vertexShader = glCreateShader(GL_VERTEX_SHADER);

// Send the vertex shader source code to GL
// Note that std::string's .c_str is NULL character terminated.
    const GLchar* source = vertexSrc;
    glShaderSource(vertexShader, 1, &source, 0);

// Compile the vertex shader
    glCompileShader(vertexShader);

    GLint isCompiled = 0;
    glGetShaderiv(vertexShader, GL_COMPILE_STATUS, &isCompiled);
    if (isCompiled == GL_FALSE) {
        GLint maxLength = 0;
        glGetShaderiv(vertexShader, GL_INFO_LOG_LENGTH, &maxLength);

        // The maxLength includes the NULL character
        char * infoLog = malloc(sizeof(char) * maxLength);
        glGetShaderInfoLog(vertexShader, maxLength, &maxLength, infoLog);

        // We don't need the shader anymore.
        glDeleteShader(vertexShader);

        // Use the infoLog as you see fit.

        // In this simple program, we'll just leave
        fprintf(stderr, "%s", infoLog);
        fprintf(stderr, "Vertex shader compilation failed!\n");
        free(infoLog);
        assert(false);
        return;
    }

// Create an empty fragment shader handle
    GLuint fragmentShader = glCreateShader(GL_FRAGMENT_SHADER);

// Send the fragment shader source code to GL
// Note that std::string's .c_str is NULL character terminated.
    source = (const GLchar*) fragmentSrc;
    glShaderSource(fragmentShader, 1, &source, 0);

// Compile the fragment shader
    glCompileShader(fragmentShader);

    glGetShaderiv(fragmentShader, GL_COMPILE_STATUS, &isCompiled);
    if (isCompiled == GL_FALSE) {
        GLint maxLength = 0;
        glGetShaderiv(fragmentShader, GL_INFO_LOG_LENGTH, &maxLength);

        // The maxLength includes the NULL character
        char * infoLog = malloc(sizeof(char) * maxLength);
        glGetShaderInfoLog(fragmentShader, maxLength, &maxLength, infoLog);

        // We don't need the shader anymore.
        glDeleteShader(fragmentShader);
        // Either of them. Don't leak shaders.
        glDeleteShader(vertexShader);

        // Use the infoLog as you see fit.

        // In this simple program, we'll just leave
        fprintf(stderr, "%s", infoLog);
        fprintf(stderr, "Fragment shader compilation failed!\n");
        free(infoLog);
        assert(false);
        return;
    }

// Vertex and fragment shaders are successfully compiled.
// Now time to link them together into a program.
// Get a program object.
    *shaderId = glCreateProgram();
    GLuint program = *shaderId;

// Attach our shaders to our program
    glAttachShader(program, vertexShader);
    glAttachShader(program, fragmentShader);

// Link our program
    glLinkProgram(program);

// Note the different functions here: glGetProgram* instead of glGetShader*.
    GLint isLinked = 0;
    glGetProgramiv(program, GL_LINK_STATUS, (int*) &isLinked);
    if (isLinked == GL_FALSE) {
        GLint maxLength = 0;
        glGetProgramiv(program, GL_INFO_LOG_LENGTH, &maxLength);

        // The maxLength includes the NULL character
        char * infoLog = malloc(sizeof(char) * maxLength);
        glGetProgramInfoLog(program, maxLength, &maxLength, infoLog);

        // We don't need the program anymore.
        glDeleteProgram(program);
        // Don't leak shaders either.
        glDeleteShader(vertexShader);
        glDeleteShader(fragmentShader);

        // Use the infoLog as you see fit.

        // In this simple program, we'll just leave
        fprintf(stderr, "%s", infoLog);
        fprintf(stderr, "Shader linking failed!\n");
        free(infoLog);
        assert(false);
        return;
    }

// Always detach shaders after a successful link.
    glDetachShader(program, vertexShader);
    glDetachShader(program, fragmentShader);
}